

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

void __thiscall
type_safe::
basic_variant<type_safe::detail::non_empty_variant_policy<false>,int,evil_variant_test_type>::
emplace_impl<evil_variant_test_type,double>
          (basic_variant<type_safe::detail::non_empty_variant_policy<false>,int,evil_variant_test_type>
           *this,undefined8 param_2)

{
  bool bVar1;
  tagged_union<int,_evil_variant_test_type> *ptVar2;
  double *args_local;
  basic_variant<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
  *this_local;
  
  ptVar2 = detail::
           variant_storage<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
           ::get_union((variant_storage<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
                        *)this);
  bVar1 = tagged_union<int,_evil_variant_test_type>::has_value(ptVar2);
  if (bVar1) {
    ptVar2 = detail::
             variant_storage<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
             ::get_union((variant_storage<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
                          *)this);
    detail::non_empty_variant_policy<false>::
    change_value<evil_variant_test_type,int,evil_variant_test_type,double>(ptVar2,param_2);
  }
  else {
    ptVar2 = detail::
             variant_storage<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
             ::get_union((variant_storage<type_safe::detail::non_empty_variant_policy<false>,_int,_evil_variant_test_type>
                          *)this);
    tagged_union<int,evil_variant_test_type>::emplace<evil_variant_test_type,double>
              ((tagged_union<int,evil_variant_test_type> *)ptVar2,param_2);
  }
  return;
}

Assistant:

void emplace_impl(variant_type<T> type, Args&&... args)
    {
        if (storage_.get_union().has_value())
            VariantPolicy::change_value(type, storage_.get_union(), std::forward<Args>(args)...);
        else
            storage_.get_union().emplace(type, std::forward<Args>(args)...);
    }